

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

DynamicType *
Js::PathTypeHandlerBase::CreateTypeForNewScObject
          (ScriptContext *scriptContext,DynamicType *type,PropertyIdArray *propIds,bool shareType)

{
  code *pcVar1;
  PathTypeHandlerBase *pPVar2;
  PropertyIdArray *predecessorType;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  DynamicTypeHandler **ppDVar6;
  DynamicType *pDVar7;
  PathTypeSuccessorKey local_58;
  PathTypeSuccessorKey local_50;
  RecyclerWeakReference<Js::DynamicType> *local_48;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  PropertyIndex propertyIndex;
  PathTypeHandlerBase *pPStack_38;
  PropertyId propertyId;
  PathTypeHandlerBase *pathHandler;
  uint i;
  bool check__proto__;
  uint count;
  bool shareType_local;
  PropertyIdArray *propIds_local;
  DynamicType *type_local;
  ScriptContext *scriptContext_local;
  
  check__proto__ = shareType;
  _count = propIds;
  propIds_local = (PropertyIdArray *)type;
  type_local = (DynamicType *)scriptContext;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x775,"(scriptContext)","scriptContext");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  i = _count->count;
  bVar3 = UsePathTypeHandlerForObjectLiteral(_count,(bool *)((long)&pathHandler + 7));
  if (bVar3) {
    *(int *)((long)&type_local[0x29].super_Type.propertyCache.ptr + (ulong)i * 4) =
         *(int *)((long)&type_local[0x29].super_Type.propertyCache.ptr + (ulong)i * 4) + 1;
    for (pathHandler._0_4_ = 0; (uint)pathHandler < i; pathHandler._0_4_ = (uint)pathHandler + 1) {
      ppDVar6 = Memory::PointerValue<Js::DynamicTypeHandler>
                          ((WriteBarrierPtr<Js::DynamicTypeHandler> *)(propIds_local + 5));
      pPStack_38 = (PathTypeHandlerBase *)*ppDVar6;
      nextTypeWeakRef._4_4_ = (&_count[1].count)[(uint)pathHandler];
      nextTypeWeakRef._2_2_ = GetPropertyIndex(pPStack_38,nextTypeWeakRef._4_4_);
      pPVar2 = pPStack_38;
      if (nextTypeWeakRef._2_2_ == 0xffff) {
        PathTypeSuccessorKey::PathTypeSuccessorKey
                  (&local_50,nextTypeWeakRef._4_4_,ObjectSlotAttr_Default);
        bVar4 = GetSuccessor(pPVar2,local_50,&local_48);
        bVar3 = true;
        if (bVar4) {
          pDVar7 = Memory::RecyclerWeakReference<Js::DynamicType>::Get(local_48);
          bVar3 = pDVar7 == (DynamicType *)0x0;
        }
        predecessorType = propIds_local;
        pPVar2 = pPStack_38;
        if (bVar3) {
          *(int *)((long)&type_local[0x29].super_Type.entryPoint + 4) =
               *(int *)((long)&type_local[0x29].super_Type.entryPoint + 4) + 1;
        }
        PathTypeSuccessorKey::PathTypeSuccessorKey
                  (&local_58,nextTypeWeakRef._4_4_,ObjectSlotAttr_Default);
        propIds_local =
             (PropertyIdArray *)
             PromoteType<true>(pPVar2,(DynamicType *)predecessorType,local_58,
                               (bool)(check__proto__ & 1),(ScriptContext *)type_local,
                               (DynamicObject *)0x0,(PropertyIndex *)((long)&nextTypeWeakRef + 2));
      }
    }
  }
  else if (i < 0xffff) {
    propIds_local =
         (PropertyIdArray *)
         SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
         CreateTypeForNewScObject
                   ((ScriptContext *)type_local,(DynamicType *)propIds_local,_count,
                    (bool)(check__proto__ & 1),(bool)(pathHandler._7_1_ & 1));
  }
  else {
    if (0x3fffffff < i) {
      Throw::OutOfMemory();
    }
    propIds_local =
         (PropertyIdArray *)
         SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
         CreateTypeForNewScObject
                   ((ScriptContext *)type_local,(DynamicType *)propIds_local,_count,
                    (bool)(check__proto__ & 1),(bool)(pathHandler._7_1_ & 1));
  }
  return (DynamicType *)propIds_local;
}

Assistant:

DynamicType* PathTypeHandlerBase::CreateTypeForNewScObject(ScriptContext* scriptContext, DynamicType* type, const Js::PropertyIdArray *propIds, bool shareType)
    {
        Assert(scriptContext);
        uint count = propIds->count;

        bool check__proto__;
        if (UsePathTypeHandlerForObjectLiteral(propIds, &check__proto__))
        {
#ifdef PROFILE_OBJECT_LITERALS
            scriptContext->objectLiteralCount[count]++;
#endif
            for (uint i = 0; i < count; i++)
            {
                PathTypeHandlerBase *pathHandler = (PathTypeHandlerBase *)PointerValue(type->typeHandler);
                Js::PropertyId propertyId = propIds->elements[i];

                PropertyIndex propertyIndex = pathHandler->GetPropertyIndex(propertyId);

                if (propertyIndex != Constants::NoSlot)
                {
                    continue;
                }

#ifdef PROFILE_OBJECT_LITERALS
                {
                    RecyclerWeakReference<DynamicType>* nextTypeWeakRef;
                    if (!pathHandler->GetSuccessor(PathTypeSuccessorKey(propertyId, ObjectSlotAttr_Default), &nextTypeWeakRef) || nextTypeWeakRef->Get() == nullptr)
                    {
                        scriptContext->objectLiteralPathCount++;
                    }
                }
#endif
                type = pathHandler->PromoteType<true>(type, PathTypeSuccessorKey(propertyId, ObjectSlotAttr_Default), shareType, scriptContext, nullptr, &propertyIndex);
            }
        }
        else if (count <= static_cast<uint>(SimpleDictionaryTypeHandler::MaxPropertyIndexSize))
        {
            type = SimpleDictionaryTypeHandler::CreateTypeForNewScObject(scriptContext, type, propIds, shareType, check__proto__);
        }
        else if (count <= static_cast<uint>(BigSimpleDictionaryTypeHandler::MaxPropertyIndexSize))
        {
            type = BigSimpleDictionaryTypeHandler::CreateTypeForNewScObject(scriptContext, type, propIds, shareType, check__proto__);
        }
        else
        {
            Throw::OutOfMemory();
        }

        return type;
    }